

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

WildcardDimensionSpecifierSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::WildcardDimensionSpecifierSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Token star;
  WildcardDimensionSpecifierSyntax *pWVar1;
  Info *in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pWVar1 = (WildcardDimensionSpecifierSyntax *)
           allocate(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8);
  star.info = in_RSI;
  star._0_8_ = in_RSI->location;
  slang::syntax::WildcardDimensionSpecifierSyntax::WildcardDimensionSpecifierSyntax
            ((WildcardDimensionSpecifierSyntax *)in_RSI->rawTextPtr,star);
  return pWVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }